

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGCheckCycles(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,int depth)

{
  int local_28;
  int ret;
  int depth_local;
  xmlRelaxNGDefinePtr_conflict cur_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  local_28 = 0;
  _ret = cur;
  do {
    if (local_28 != 0 || _ret == (xmlRelaxNGDefinePtr_conflict)0x0) {
      return local_28;
    }
    if ((_ret->type == XML_RELAXNG_REF) || (_ret->type == XML_RELAXNG_PARENTREF)) {
      if (_ret->depth == -1) {
        _ret->depth = (short)depth;
        local_28 = xmlRelaxNGCheckCycles(ctxt,_ret->content,depth);
        _ret->depth = -2;
      }
      else if (depth == _ret->depth) {
        xmlRngPErr(ctxt,_ret->node,1099,"Detected a cycle in %s references\n",_ret->name,
                   (xmlChar *)0x0);
        return -1;
      }
    }
    else if (_ret->type == XML_RELAXNG_ELEMENT) {
      local_28 = xmlRelaxNGCheckCycles(ctxt,_ret->content,depth + 1);
    }
    else {
      local_28 = xmlRelaxNGCheckCycles(ctxt,_ret->content,depth);
    }
    _ret = _ret->next;
  } while( true );
}

Assistant:

static int
xmlRelaxNGCheckCycles(xmlRelaxNGParserCtxtPtr ctxt,
                      xmlRelaxNGDefinePtr cur, int depth)
{
    int ret = 0;

    while ((ret == 0) && (cur != NULL)) {
        if ((cur->type == XML_RELAXNG_REF) ||
            (cur->type == XML_RELAXNG_PARENTREF)) {
            if (cur->depth == -1) {
                cur->depth = depth;
                ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth);
                cur->depth = -2;
            } else if (depth == cur->depth) {
                xmlRngPErr(ctxt, cur->node, XML_RNGP_REF_CYCLE,
                           "Detected a cycle in %s references\n",
                           cur->name, NULL);
                return (-1);
            }
        } else if (cur->type == XML_RELAXNG_ELEMENT) {
            ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth + 1);
        } else {
            ret = xmlRelaxNGCheckCycles(ctxt, cur->content, depth);
        }
        cur = cur->next;
    }
    return (ret);
}